

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrtf.cpp
# Opt level: O1

vector<std::string> *
EnumerateHrtf_abi_cxx11_(vector<std::string> *__return_storage_ptr__,char *devname)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined8 uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  pointer pHVar7;
  size_t sVar8;
  long *plVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
  _Var10;
  uint uVar11;
  long lVar12;
  HrtfEntry *pHVar13;
  uint __len;
  pointer pHVar14;
  __normal_iterator<const_(anonymous_namespace)::HrtfEntry_*,_std::vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>_>
  __it;
  __normal_iterator<const_(anonymous_namespace)::HrtfEntry_*,_std::vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>_>
  __it_00;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fname;
  HrtfEntry *__a;
  pointer __s;
  string *psVar15;
  HrtfEntry *pHVar16;
  pointer pHVar17;
  __normal_iterator<const_(anonymous_namespace)::HrtfEntry_*,_std::vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>_>
  _Var18;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pathopt
  ;
  string pname;
  string newname;
  string __str;
  undefined1 local_108 [24];
  undefined1 local_f0 [8];
  undefined8 *puStack_e8;
  undefined8 local_d8 [2];
  undefined1 local_c8 [24];
  undefined1 auStack_b0 [16];
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  HrtfEntry *local_80;
  long *local_78;
  long local_70;
  long local_68 [2];
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = devname;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::EnumeratedHrtfLock);
  pHVar16 = DAT_0022df20;
  pHVar13 = (anonymous_namespace)::EnumeratedHrtfs;
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  __a = (anonymous_namespace)::EnumeratedHrtfs;
  if (DAT_0022df20 != (anonymous_namespace)::EnumeratedHrtfs) {
    do {
      std::allocator_traits<al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>::
      destroy<(anonymous_namespace)::HrtfEntry>
                ((allocator<(anonymous_namespace)::HrtfEntry,_8UL> *)__a,(HrtfEntry *)devname);
      __a = __a + 1;
    } while (__a != pHVar16);
    DAT_0022df20 = pHVar13;
  }
  ConfigValueStr_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_c8,local_58,(char *)0x0,"hrtf-paths");
  uVar3 = local_108._0_8_;
  local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
  local_108._8_8_ = (pointer)0x0;
  local_108._16_8_ = (pointer)0x0;
  local_f0 = (undefined1  [8])0x0;
  puStack_e8 = (undefined8 *)0x0;
  if (local_c8[0] == (string)0x1) {
    local_108._8_8_ = local_f0;
    if ((undefined1 *)local_c8._8_8_ == auStack_b0) {
      puStack_e8 = (undefined8 *)auStack_b0._8_8_;
    }
    else {
      local_108._8_8_ = local_c8._8_8_;
    }
    local_f0 = (undefined1  [8])auStack_b0._0_8_;
    local_108._16_8_ = local_c8._16_8_;
    local_c8._16_8_ = (pointer)0x0;
    auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
    local_108._1_7_ = SUB87(uVar3,1);
    local_108[0] = (_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
                    )0x1;
    local_c8._8_8_ = auStack_b0;
  }
  if (local_108[0] ==
      (_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
       )0x1) {
    bVar5 = true;
    if ((pointer)local_108._8_8_ != (pointer)0x0) {
      pHVar14 = (pointer)local_108._8_8_;
      do {
        if (*(char *)&(pHVar14->mDispName)._M_dataplus._M_p == '\0') break;
        __s = (pointer)((long)&pHVar14[-1].mFilename.field_2 + 0xf);
        do {
          do {
            cVar1 = *(char *)((long)&(__s->mDispName)._M_dataplus._M_p + 1);
            __s = (pointer)((long)&(__s->mDispName)._M_dataplus._M_p + 1);
            iVar6 = isspace((int)cVar1);
          } while (cVar1 == 0x2c);
        } while (iVar6 != 0);
        pHVar14 = __s;
        if (cVar1 != '\0') {
          pHVar7 = (pointer)strchr((char *)__s,0x2c);
          if (pHVar7 == (pointer)0x0) {
            sVar8 = strlen((char *)__s);
            pHVar14 = (pointer)0x0;
            bVar5 = false;
            pHVar7 = (pointer)((long)&(__s->mDispName)._M_dataplus._M_p + sVar8);
          }
          else {
            pHVar14 = (pointer)((long)&(pHVar7->mDispName)._M_dataplus._M_p + 1);
          }
          do {
            pHVar17 = pHVar7;
            if (pHVar17 == __s) goto LAB_00153157;
            iVar6 = isspace((int)pHVar17[-1].mFilename.field_2._M_local_buf[0xf]);
            pHVar7 = (pointer)((long)&pHVar17[-1].mFilename.field_2 + 0xf);
          } while (iVar6 != 0);
          local_c8._0_8_ = local_c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,__s,pHVar17);
          SearchDataFiles_abi_cxx11_((vector<std::string> *)local_a0,".mhr",(char *)local_c8._0_8_);
          uVar3 = local_a0._8_8_;
          for (psVar15 = (string *)local_a0._0_8_; psVar15 != (string *)uVar3; psVar15 = psVar15 + 1
              ) {
            anon_unknown.dwarf_1c614d::AddFileEntry(psVar15);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
          ::~vector((vector<std::string> *)local_a0);
          if ((HrtfEntry *)local_c8._0_8_ != (HrtfEntry *)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
          }
        }
LAB_00153157:
      } while (pHVar14 != (pointer)0x0);
    }
    if ((local_108[0] ==
         (_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
          )0x1) && ((pointer)local_108._8_8_ != (pointer)local_f0)) {
      operator_delete((void *)local_108._8_8_,(ulong)((long)local_f0 + 1));
    }
    if (!bVar5) goto LAB_001536c0;
  }
  SearchDataFiles_abi_cxx11_((vector<std::string> *)local_108,".mhr","openal/hrtf");
  uVar3 = local_108._8_8_;
  for (pHVar14 = (pointer)local_108._0_8_; pHVar14 != (pointer)uVar3;
      pHVar14 = (pointer)&pHVar14->mFilename) {
    anon_unknown.dwarf_1c614d::AddFileEntry(&pHVar14->mDispName);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             *)local_108);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Built-In HRTF","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
  *(undefined1 *)local_50[0] = 0x31;
  plVar9 = (long *)std::__cxx11::string::insert((ulong)local_50,0,'\x01');
  local_a0._0_8_ = local_a0 + 0x10;
  psVar15 = (string *)(plVar9 + 2);
  if ((string *)*plVar9 == psVar15) {
    local_90._M_allocated_capacity = (size_type)(psVar15->_M_dataplus)._M_p;
    local_90._8_8_ = plVar9[3];
  }
  else {
    local_90._M_allocated_capacity = (size_type)(psVar15->_M_dataplus)._M_p;
    local_a0._0_8_ = (string *)*plVar9;
  }
  local_a0._8_8_ = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_a0,local_a0._8_8_,0,'\x01');
  pHVar14 = (pointer)(plVar9 + 2);
  if ((pointer)*plVar9 == pHVar14) {
    local_108._16_8_ = (pHVar14->mDispName)._M_dataplus._M_p;
    local_f0 = (undefined1  [8])plVar9[3];
    local_108._0_8_ = (pointer)(local_108 + 0x10);
  }
  else {
    local_108._16_8_ = (pHVar14->mDispName)._M_dataplus._M_p;
    local_108._0_8_ = (pointer)*plVar9;
  }
  local_108._8_8_ = plVar9[1];
  *plVar9 = (long)pHVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append(local_108,(ulong)local_78);
  local_c8._0_8_ = local_c8 + 0x10;
  pHVar13 = (HrtfEntry *)(plVar9 + 2);
  if ((HrtfEntry *)*plVar9 == pHVar13) {
    local_c8._16_8_ = (pHVar13->mDispName)._M_dataplus._M_p;
    auStack_b0._0_8_ = plVar9[3];
  }
  else {
    local_c8._16_8_ = (pHVar13->mDispName)._M_dataplus._M_p;
    local_c8._0_8_ = (HrtfEntry *)*plVar9;
  }
  local_c8._8_8_ = plVar9[1];
  *plVar9 = (long)pHVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_,
                    (ulong)((long)&(((string *)local_108._16_8_)->_M_dataplus)._M_p + 1));
  }
  if ((string *)local_a0._0_8_ != (string *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  lVar12 = (long)DAT_0022df20 - (long)(anonymous_namespace)::EnumeratedHrtfs >> 8;
  __it_00._M_current = (anonymous_namespace)::EnumeratedHrtfs;
  pHVar13 = DAT_0022df20;
  local_108._0_8_ = (pointer)local_c8;
  if (0 < lVar12) {
    local_80 = DAT_0022df20;
    __it_00._M_current =
         (HrtfEntry *)
         ((long)&((anonymous_namespace)::EnumeratedHrtfs->mDispName)._M_dataplus._M_p +
         ((long)DAT_0022df20 - (long)(anonymous_namespace)::EnumeratedHrtfs & 0xffffffffffffff00U));
    lVar12 = lVar12 + 1;
    __it._M_current = (anonymous_namespace)::EnumeratedHrtfs;
    do {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
                            *)local_108,__it);
      pHVar13 = local_80;
      _Var18._M_current = __it._M_current;
      if (bVar5) goto LAB_0015349f;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
                            *)local_108,__it._M_current + 1);
      pHVar13 = local_80;
      _Var18._M_current = __it._M_current + 1;
      if (bVar5) goto LAB_0015349f;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
                            *)local_108,__it._M_current + 2);
      pHVar13 = local_80;
      _Var18._M_current = __it._M_current + 2;
      if (bVar5) goto LAB_0015349f;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
                            *)local_108,__it._M_current + 3);
      pHVar13 = local_80;
      _Var18._M_current = __it._M_current + 3;
      if (bVar5) goto LAB_0015349f;
      __it._M_current = __it._M_current + 4;
      lVar12 = lVar12 + -1;
    } while (1 < lVar12);
  }
  lVar12 = (long)pHVar13 - (long)__it_00._M_current >> 6;
  if (lVar12 == 1) {
LAB_0015347e:
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
                          *)local_108,__it_00);
    _Var18._M_current = __it_00._M_current;
    if (!bVar5) {
      _Var18._M_current = pHVar13;
    }
  }
  else if (lVar12 == 2) {
LAB_0015346b:
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
                          *)local_108,__it_00);
    _Var18._M_current = __it_00._M_current;
    if (!bVar5) {
      __it_00._M_current = __it_00._M_current + 1;
      goto LAB_0015347e;
    }
  }
  else {
    _Var18._M_current = pHVar13;
    if ((lVar12 == 3) &&
       (bVar5 = __gnu_cxx::__ops::
                _Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::$_0>
                ::operator()((_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
                              *)local_108,__it_00), _Var18._M_current = __it_00._M_current, !bVar5))
    {
      __it_00._M_current = __it_00._M_current + 1;
      goto LAB_0015346b;
    }
  }
LAB_0015349f:
  if (_Var18._M_current == pHVar13) {
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_a0,local_78,local_70 + (long)local_78)
    ;
    bVar5 = anon_unknown.dwarf_1c614d::checkName((string *)local_a0);
    if (bVar5) {
      uVar11 = 1;
      do {
        std::__cxx11::string::_M_assign((string *)local_a0);
        std::__cxx11::string::append((char *)local_a0);
        __val = uVar11 + 1;
        __len = 1;
        if (8 < uVar11) {
          uVar11 = __val;
          uVar4 = 4;
          do {
            __len = uVar4;
            if (uVar11 < 100) {
              __len = __len - 2;
              goto LAB_0015357f;
            }
            if (uVar11 < 1000) {
              __len = __len - 1;
              goto LAB_0015357f;
            }
            if (uVar11 < 10000) goto LAB_0015357f;
            bVar5 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            uVar4 = __len + 4;
          } while (bVar5);
          __len = __len + 1;
        }
LAB_0015357f:
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct((ulong)local_108,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_108._0_8_,__len,__val);
        std::__cxx11::string::_M_append((char *)local_a0,local_108._0_8_);
        if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,
                          (ulong)((long)&(((string *)local_108._16_8_)->_M_dataplus)._M_p + 1));
        }
        bVar5 = anon_unknown.dwarf_1c614d::checkName((string *)local_a0);
        uVar11 = __val;
      } while (bVar5);
    }
    local_108._0_8_ = (pointer)(local_108 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,local_a0._0_8_,(pointer)(local_a0._0_8_ + local_a0._8_8_));
    pHVar13 = (HrtfEntry *)local_c8._0_8_;
    puStack_e8 = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_f0 + 8),local_c8._0_8_,(pointer)(local_c8._0_8_ + local_c8._8_8_));
    std::
    vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>
    ::emplace_back<(anonymous_namespace)::HrtfEntry>
              ((vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>
                *)local_108,pHVar13);
    if (puStack_e8 != local_d8) {
      operator_delete(puStack_e8,local_d8[0] + 1);
    }
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,
                      (ulong)((long)&(((string *)local_108._16_8_)->_M_dataplus)._M_p + 1));
    }
    if (2 < (int)gLogLevel) {
      EnumerateHrtf_abi_cxx11_();
    }
    if ((string *)local_a0._0_8_ != (string *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._M_allocated_capacity + 1));
    }
  }
  else if (2 < (int)gLogLevel) {
    EnumerateHrtf_abi_cxx11_();
  }
  if ((HrtfEntry *)local_c8._0_8_ != (HrtfEntry *)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
LAB_001536c0:
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  ::reserve(__return_storage_ptr__,
            (long)DAT_0022df20 - (long)(anonymous_namespace)::EnumeratedHrtfs >> 6);
  pHVar13 = DAT_0022df20;
  for (pHVar16 = (anonymous_namespace)::EnumeratedHrtfs; pHVar16 != pHVar13; pHVar16 = pHVar16 + 1)
  {
    std::vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>> *)
               __return_storage_ptr__,&pHVar16->mDispName);
  }
  ConfigValueStr_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_c8,local_58,(char *)0x0,"default-hrtf");
  uVar3 = local_108._0_8_;
  local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
  local_108._8_8_ = (pointer)0x0;
  local_108._16_8_ = (pointer)0x0;
  local_f0 = (undefined1  [8])0x0;
  puStack_e8 = (undefined8 *)0x0;
  if (local_c8[0] == (string)0x1) {
    local_108._8_8_ = local_f0;
    if ((undefined1 *)local_c8._8_8_ == auStack_b0) {
      puStack_e8 = (undefined8 *)auStack_b0._8_8_;
    }
    else {
      local_108._8_8_ = local_c8._8_8_;
    }
    local_f0 = (undefined1  [8])auStack_b0._0_8_;
    local_108._16_8_ = local_c8._16_8_;
    local_c8._16_8_ = (pointer)0x0;
    auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
    local_108._1_7_ = SUB87(uVar3,1);
    local_108[0] = (_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
                    )0x1;
    local_c8._8_8_ = auStack_b0;
  }
  if (local_108[0] ==
      (_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
       )0x1) {
    _Var10 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       ((__return_storage_ptr__->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        (__return_storage_ptr__->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                        )._M_impl.super__Vector_impl_data._M_finish,local_108 + 8);
    if (_Var10._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (1 < (int)gLogLevel) {
        EnumerateHrtf_abi_cxx11_();
      }
    }
    else {
      pbVar2 = (__return_storage_ptr__->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (_Var10._M_current != pbVar2) {
        std::_V2::
        __rotate<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>>>>
                  (pbVar2,_Var10._M_current,_Var10._M_current + 1);
      }
    }
  }
  if ((local_108[0] ==
       (_Iter_pred<(anonymous_namespace)::AddBuiltInEntry(std::__cxx11::string_const&,unsigned_int)::__0>
        )0x1) && ((pointer)local_108._8_8_ != (pointer)local_f0)) {
    operator_delete((void *)local_108._8_8_,(ulong)((long)local_f0 + 1));
  }
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::EnumeratedHrtfLock);
  return __return_storage_ptr__;
}

Assistant:

al::vector<std::string> EnumerateHrtf(const char *devname)
{
    std::lock_guard<std::mutex> _{EnumeratedHrtfLock};
    EnumeratedHrtfs.clear();

    bool usedefaults{true};
    if(auto pathopt = ConfigValueStr(devname, nullptr, "hrtf-paths"))
    {
        const char *pathlist{pathopt->c_str()};
        while(pathlist && *pathlist)
        {
            const char *next, *end;

            while(isspace(*pathlist) || *pathlist == ',')
                pathlist++;
            if(*pathlist == '\0')
                continue;

            next = strchr(pathlist, ',');
            if(next)
                end = next++;
            else
            {
                end = pathlist + strlen(pathlist);
                usedefaults = false;
            }

            while(end != pathlist && isspace(*(end-1)))
                --end;
            if(end != pathlist)
            {
                const std::string pname{pathlist, end};
                for(const auto &fname : SearchDataFiles(".mhr", pname.c_str()))
                    AddFileEntry(fname);
            }

            pathlist = next;
        }
    }

    if(usedefaults)
    {
        for(const auto &fname : SearchDataFiles(".mhr", "openal/hrtf"))
            AddFileEntry(fname);

        if(!GetResource(IDR_DEFAULT_HRTF_MHR).empty())
            AddBuiltInEntry("Built-In HRTF", IDR_DEFAULT_HRTF_MHR);
    }

    al::vector<std::string> list;
    list.reserve(EnumeratedHrtfs.size());
    for(auto &entry : EnumeratedHrtfs)
        list.emplace_back(entry.mDispName);

    if(auto defhrtfopt = ConfigValueStr(devname, nullptr, "default-hrtf"))
    {
        auto iter = std::find(list.begin(), list.end(), *defhrtfopt);
        if(iter == list.end())
            WARN("Failed to find default HRTF \"%s\"\n", defhrtfopt->c_str());
        else if(iter != list.begin())
            std::rotate(list.begin(), iter, iter+1);
    }

    return list;
}